

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckDoubleMultipleOf
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,double d)

{
  bool bVar1;
  ValueType *this_00;
  Ch *pCVar2;
  int __x;
  SValue *this_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa_01;
  bool isMultiple;
  double difference;
  double scaledEpsilon;
  double qRounded;
  double q;
  double b;
  double a;
  double d_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  std::abs((int)this);
  this_01 = &this->multipleOf_;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(this_01);
  __x = (int)this_01;
  std::abs(__x);
  dVar3 = floor(extraout_XMM0_Qa / extraout_XMM0_Qa_00 + 0.5);
  dVar4 = std::numeric_limits<double>::epsilon();
  std::abs(__x);
  bVar1 = true;
  if ((extraout_XMM0_Qa / extraout_XMM0_Qa_00 + dVar3) * dVar4 < extraout_XMM0_Qa_01) {
    dVar3 = std::numeric_limits<double>::min();
    bVar1 = extraout_XMM0_Qa_01 < dVar3;
  }
  if (!bVar1) {
    (*context->error_handler->_vptr_IValidationErrorHandler[4])
              (d,context->error_handler,&this->multipleOf_);
    context->invalidCode = kValidateErrorMultipleOf;
    this_00 = GetValidateErrorKeyword(kValidateErrorMultipleOf);
    pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
    context->invalidKeyword = pCVar2;
  }
  return bVar1;
}

Assistant:

bool CheckDoubleMultipleOf(Context& context, double d) const {
        double a = std::abs(d), b = std::abs(multipleOf_.GetDouble());
        double q = a / b;
        double qRounded = std::floor(q + 0.5);
        double scaledEpsilon = (q + qRounded) * std::numeric_limits<double>::epsilon();
        double difference = std::abs(qRounded - q);
        bool isMultiple = difference <= scaledEpsilon || difference < (std::numeric_limits<double>::min)();
        if (!isMultiple) {
            context.error_handler.NotMultipleOf(d, multipleOf_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
        }
        return true;
    }